

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_writers.h
# Opt level: O0

void date::number_writer<0>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,int>
               (ostreambuf_iterator<char,_std::char_traits<char>_> *dst,int value)

{
  char __c;
  value_type *pvVar1;
  ostreambuf_iterator<char,_std::char_traits<char>_> *poVar2;
  undefined1 local_30 [8];
  static_string<char,_11UL> digits;
  int value_local;
  ostreambuf_iterator<char,_std::char_traits<char>_> *dst_local;
  
  local_30[0] = '0';
  local_30[1] = '1';
  local_30[2] = '2';
  local_30[3] = '3';
  local_30[4] = '4';
  local_30[5] = '5';
  local_30[6] = '6';
  local_30[7] = '7';
  digits.m_data._M_elems[0] = '8';
  digits.m_data._M_elems[1] = '9';
  digits.m_data._M_elems[2] = '\0';
  digits.m_data._M_elems[3] = '\0';
  digits.m_data._M_elems[4] = '\0';
  digits.m_data._M_elems[5] = '\0';
  digits.m_data._M_elems[6] = '\0';
  digits.m_data._M_elems[7] = '\0';
  digits.m_data._M_elems[8] = '\n';
  digits.m_data._M_elems[9] = '\0';
  digits.m_data._M_elems[10] = '\0';
  digits._11_5_ = 0;
  if (value != 0) {
    digits.m_length._4_4_ = value;
    write<std::ostreambuf_iterator<char,std::char_traits<char>>,int>(dst,value / 10);
    pvVar1 = static_string<char,_11UL>::operator[]
                       ((static_string<char,_11UL> *)local_30,(long)(digits.m_length._4_4_ % 10));
    __c = *pvVar1;
    poVar2 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(dst,0);
    poVar2 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar2);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(poVar2,__c);
  }
  return;
}

Assistant:

static void write(Iterator& dst, Number value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto digits = number_writer<0>::digits<char_type>();
        if (value == 0)
            return;
        number_writer<0>::write(dst, value / 10);
        *(dst++) = digits[value % 10];
    }